

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  float **ppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  byte bVar25;
  int iVar26;
  int iVar27;
  NodeRef *pNVar28;
  RayK<4> *pRVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  NodeRef *pNVar34;
  Scene *pSVar35;
  ulong uVar36;
  int in_R11D;
  size_t sVar37;
  ulong uVar38;
  float fVar39;
  uint uVar40;
  float fVar44;
  float fVar46;
  vint4 bi;
  uint uVar45;
  uint uVar47;
  float fVar48;
  uint uVar49;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar50;
  float fVar60;
  float fVar66;
  vint4 ai;
  uint uVar51;
  uint uVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  uint uVar61;
  uint uVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  uint uVar67;
  uint uVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  uint uVar72;
  uint uVar73;
  float fVar74;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  uint uVar75;
  uint uVar78;
  uint uVar79;
  vint4 ai_1;
  uint uVar80;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar81;
  float fVar84;
  float fVar85;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar86;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar99;
  float fVar100;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar101;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar107;
  float fVar108;
  int iVar109;
  float fVar110;
  float fVar111;
  int iVar112;
  float fVar113;
  int iVar114;
  float fVar115;
  int iVar116;
  float fVar117;
  int iVar118;
  float fVar119;
  int iVar120;
  float fVar121;
  int iVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  NodeRef *local_b60;
  undefined1 local_b58 [16];
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  undefined8 local_b38;
  float fStack_b30;
  float fStack_b2c;
  undefined1 (*local_b20) [16];
  long local_b18;
  Scene *scene;
  uint *local_b08;
  ulong local_b00;
  RTCFilterFunctionNArguments args;
  float fStack_ab4;
  float fStack_a9c;
  float fStack_a80;
  float fStack_a7c;
  float fStack_a40;
  float fStack_a3c;
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  float local_968 [4];
  float local_958 [4];
  float local_948 [4];
  float local_938 [4];
  undefined1 local_928 [16];
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined1 local_908 [8];
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  undefined4 local_8e8;
  undefined4 uStack_8e4;
  undefined4 uStack_8e0;
  undefined4 uStack_8dc;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  uint local_8b8;
  uint uStack_8b4;
  uint uStack_8b0;
  uint uStack_8ac;
  uint local_8a8;
  uint uStack_8a4;
  uint uStack_8a0;
  uint uStack_89c;
  uint local_898;
  uint uStack_894;
  uint uStack_890;
  uint uStack_88c;
  undefined1 local_888 [16];
  undefined8 local_878;
  undefined8 uStack_870;
  int local_868;
  int iStack_864;
  int iStack_860;
  int iStack_85c;
  int local_858;
  int iStack_854;
  int iStack_850;
  int iStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar81 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar84 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar95 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar85 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar124 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar127 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar33 = uVar36 ^ 0x10;
  iVar27 = (tray->tnear).field_0.i[k];
  iVar116 = (tray->tfar).field_0.i[k];
  local_878 = mm_lookupmask_ps._0_8_;
  uStack_870 = mm_lookupmask_ps._8_8_;
  local_888 = mm_lookupmask_ps._240_16_;
  local_b20 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_7f8 = fVar81;
  fStack_7f4 = fVar81;
  fStack_7f0 = fVar81;
  fStack_7ec = fVar81;
  local_808 = fVar84;
  fStack_804 = fVar84;
  fStack_800 = fVar84;
  fStack_7fc = fVar84;
  local_818 = fVar95;
  fStack_814 = fVar95;
  fStack_810 = fVar95;
  fStack_80c = fVar95;
  local_828 = fVar85;
  fStack_824 = fVar85;
  fStack_820 = fVar85;
  fStack_81c = fVar85;
  local_838 = fVar124;
  fStack_834 = fVar124;
  fStack_830 = fVar124;
  fStack_82c = fVar124;
  local_848 = fVar127;
  fStack_844 = fVar127;
  fStack_840 = fVar127;
  fStack_83c = fVar127;
  local_858 = iVar27;
  iStack_854 = iVar27;
  iStack_850 = iVar27;
  iStack_84c = iVar27;
  local_868 = iVar116;
  iStack_864 = iVar116;
  iStack_860 = iVar116;
  iStack_85c = iVar116;
  local_b60 = stack + 1;
  fVar96 = fVar84;
  fVar128 = fVar84;
  fVar55 = fVar84;
  fVar108 = fVar85;
  fVar54 = fVar85;
  fVar135 = fVar85;
  iVar109 = iVar27;
  iVar112 = iVar27;
  iVar114 = iVar27;
  iVar118 = iVar116;
  iVar120 = iVar116;
  iVar122 = iVar116;
  fVar125 = fVar81;
  fVar131 = fVar81;
  fVar99 = fVar81;
  fVar132 = fVar95;
  fVar65 = fVar95;
  fVar111 = fVar95;
  fVar64 = fVar124;
  fVar137 = fVar124;
  fVar126 = fVar124;
  fVar133 = fVar127;
  fVar100 = fVar127;
  fVar70 = fVar127;
  local_b00 = uVar36;
LAB_0070b909:
  do {
    pNVar34 = local_b60;
    if (pNVar34 == stack) {
LAB_0070c848:
      return pNVar34 != stack;
    }
    pNVar28 = pNVar34 + -1;
    sVar37 = pNVar34[-1].ptr;
    local_b60 = pNVar28;
    while ((sVar37 & 8) == 0) {
      pfVar5 = (float *)(sVar37 + 0x20 + uVar36);
      fVar39 = (*pfVar5 - fVar81) * fVar85;
      fVar44 = (pfVar5[1] - fVar125) * fVar108;
      fVar46 = (pfVar5[2] - fVar131) * fVar54;
      fVar48 = (pfVar5[3] - fVar99) * fVar135;
      pfVar5 = (float *)(sVar37 + 0x20 + uVar32);
      fVar50 = (*pfVar5 - fVar84) * fVar124;
      fVar60 = (pfVar5[1] - fVar96) * fVar64;
      fVar66 = (pfVar5[2] - fVar128) * fVar137;
      fVar71 = (pfVar5[3] - fVar55) * fVar126;
      uVar51 = (uint)((int)fVar50 < (int)fVar39) * (int)fVar39 |
               (uint)((int)fVar50 >= (int)fVar39) * (int)fVar50;
      uVar61 = (uint)((int)fVar60 < (int)fVar44) * (int)fVar44 |
               (uint)((int)fVar60 >= (int)fVar44) * (int)fVar60;
      uVar67 = (uint)((int)fVar66 < (int)fVar46) * (int)fVar46 |
               (uint)((int)fVar66 >= (int)fVar46) * (int)fVar66;
      uVar72 = (uint)((int)fVar71 < (int)fVar48) * (int)fVar48 |
               (uint)((int)fVar71 >= (int)fVar48) * (int)fVar71;
      pfVar5 = (float *)(sVar37 + 0x20 + uVar38);
      fVar39 = (*pfVar5 - fVar95) * fVar127;
      fVar44 = (pfVar5[1] - fVar132) * fVar133;
      fVar46 = (pfVar5[2] - fVar65) * fVar100;
      fVar48 = (pfVar5[3] - fVar111) * fVar70;
      uVar40 = (uint)((int)fVar39 < iVar27) * iVar27 | (uint)((int)fVar39 >= iVar27) * (int)fVar39;
      uVar45 = (uint)((int)fVar44 < iVar109) * iVar109 |
               (uint)((int)fVar44 >= iVar109) * (int)fVar44;
      uVar47 = (uint)((int)fVar46 < iVar112) * iVar112 |
               (uint)((int)fVar46 >= iVar112) * (int)fVar46;
      uVar49 = (uint)((int)fVar48 < iVar114) * iVar114 |
               (uint)((int)fVar48 >= iVar114) * (int)fVar48;
      pfVar5 = (float *)(sVar37 + 0x20 + uVar33);
      fVar39 = (*pfVar5 - fVar81) * fVar85;
      fVar44 = (pfVar5[1] - fVar125) * fVar108;
      fVar46 = (pfVar5[2] - fVar131) * fVar54;
      fVar48 = (pfVar5[3] - fVar99) * fVar135;
      pfVar5 = (float *)(sVar37 + 0x20 + (uVar32 ^ 0x10));
      fVar50 = (*pfVar5 - fVar84) * fVar124;
      fVar60 = (pfVar5[1] - fVar96) * fVar64;
      fVar66 = (pfVar5[2] - fVar128) * fVar137;
      fVar71 = (pfVar5[3] - fVar55) * fVar126;
      uVar75 = (uint)((int)fVar39 < (int)fVar50) * (int)fVar39 |
               (uint)((int)fVar39 >= (int)fVar50) * (int)fVar50;
      uVar78 = (uint)((int)fVar44 < (int)fVar60) * (int)fVar44 |
               (uint)((int)fVar44 >= (int)fVar60) * (int)fVar60;
      uVar79 = (uint)((int)fVar46 < (int)fVar66) * (int)fVar46 |
               (uint)((int)fVar46 >= (int)fVar66) * (int)fVar66;
      uVar80 = (uint)((int)fVar48 < (int)fVar71) * (int)fVar48 |
               (uint)((int)fVar48 >= (int)fVar71) * (int)fVar71;
      pfVar5 = (float *)(sVar37 + 0x20 + (uVar38 ^ 0x10));
      fVar39 = (*pfVar5 - fVar95) * fVar127;
      fVar44 = (pfVar5[1] - fVar132) * fVar133;
      fVar46 = (pfVar5[2] - fVar65) * fVar100;
      fVar48 = (pfVar5[3] - fVar111) * fVar70;
      uVar52 = (uint)(iVar116 < (int)fVar39) * iVar116 |
               (uint)(iVar116 >= (int)fVar39) * (int)fVar39;
      uVar62 = (uint)(iVar118 < (int)fVar44) * iVar118 |
               (uint)(iVar118 >= (int)fVar44) * (int)fVar44;
      uVar68 = (uint)(iVar120 < (int)fVar46) * iVar120 |
               (uint)(iVar120 >= (int)fVar46) * (int)fVar46;
      uVar73 = (uint)(iVar122 < (int)fVar48) * iVar122 |
               (uint)(iVar122 >= (int)fVar48) * (int)fVar48;
      auVar103._0_4_ =
           -(uint)((int)(((int)uVar75 < (int)uVar52) * uVar75 |
                        ((int)uVar75 >= (int)uVar52) * uVar52) <
                  (int)(((int)uVar40 < (int)uVar51) * uVar51 | ((int)uVar40 >= (int)uVar51) * uVar40
                       ));
      auVar103._4_4_ =
           -(uint)((int)(((int)uVar78 < (int)uVar62) * uVar78 |
                        ((int)uVar78 >= (int)uVar62) * uVar62) <
                  (int)(((int)uVar45 < (int)uVar61) * uVar61 | ((int)uVar45 >= (int)uVar61) * uVar45
                       ));
      auVar103._8_4_ =
           -(uint)((int)(((int)uVar79 < (int)uVar68) * uVar79 |
                        ((int)uVar79 >= (int)uVar68) * uVar68) <
                  (int)(((int)uVar47 < (int)uVar67) * uVar67 | ((int)uVar47 >= (int)uVar67) * uVar47
                       ));
      auVar103._12_4_ =
           -(uint)((int)(((int)uVar80 < (int)uVar73) * uVar80 |
                        ((int)uVar80 >= (int)uVar73) * uVar73) <
                  (int)(((int)uVar49 < (int)uVar72) * uVar72 | ((int)uVar49 >= (int)uVar72) * uVar49
                       ));
      iVar26 = movmskps((int)pNVar28,auVar103);
      if (iVar26 == 0xf) goto LAB_0070b909;
      bVar25 = (byte)iVar26 ^ 0xf;
      pNVar28 = (NodeRef *)(sVar37 & 0xfffffffffffffff0);
      lVar30 = 0;
      if (bVar25 != 0) {
        for (; (bVar25 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
        }
      }
      sVar37 = pNVar28[lVar30].ptr;
      uVar40 = bVar25 - 1 & (uint)bVar25;
      uVar31 = (ulong)uVar40;
      if (uVar40 != 0) {
        do {
          local_b60->ptr = sVar37;
          local_b60 = local_b60 + 1;
          lVar30 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
            }
          }
          sVar37 = pNVar28[lVar30].ptr;
          uVar31 = uVar31 - 1 & uVar31;
        } while (uVar31 != 0);
      }
    }
    for (lVar30 = 0; lVar30 != (ulong)((uint)sVar37 & 0xf) - 8; lVar30 = lVar30 + 1) {
      pSVar35 = context->scene;
      puVar1 = (uint *)(lVar30 * 0x60 + (sVar37 & 0xfffffffffffffff0));
      local_b08 = puVar1 + 0x10;
      ppfVar7 = (pSVar35->vertices).items;
      pfVar8 = ppfVar7[*local_b08];
      pfVar5 = pfVar8 + *puVar1;
      fVar124 = *pfVar5;
      fVar127 = pfVar5[1];
      fVar96 = pfVar5[2];
      pfVar5 = pfVar8 + puVar1[4];
      fVar128 = *pfVar5;
      fVar55 = pfVar5[1];
      fVar108 = pfVar5[2];
      pfVar5 = pfVar8 + puVar1[0xc];
      fVar54 = *pfVar5;
      local_b38._0_4_ = pfVar5[1];
      fVar135 = pfVar5[2];
      pfVar9 = ppfVar7[puVar1[0x11]];
      pfVar5 = pfVar9 + puVar1[1];
      fVar125 = *pfVar5;
      fVar131 = pfVar5[1];
      fVar99 = pfVar5[2];
      pfVar5 = pfVar9 + puVar1[5];
      fVar132 = *pfVar5;
      fVar65 = pfVar5[1];
      fVar111 = pfVar5[2];
      pfVar5 = pfVar9 + puVar1[0xd];
      fVar64 = *pfVar5;
      local_b38._4_4_ = pfVar5[1];
      fVar137 = pfVar5[2];
      pfVar10 = ppfVar7[puVar1[0x12]];
      pfVar5 = pfVar10 + puVar1[2];
      fVar126 = *pfVar5;
      fVar133 = pfVar5[1];
      fVar100 = pfVar5[2];
      pfVar5 = pfVar10 + puVar1[6];
      fVar70 = pfVar5[1];
      fVar39 = pfVar5[2];
      pfVar2 = pfVar10 + puVar1[0xe];
      fStack_b30 = pfVar2[1];
      fVar44 = pfVar2[2];
      pfVar11 = ppfVar7[puVar1[0x13]];
      pfVar3 = pfVar11 + puVar1[3];
      fVar46 = *pfVar3;
      fVar48 = pfVar3[1];
      fVar50 = pfVar3[2];
      pfVar3 = pfVar11 + puVar1[7];
      fVar60 = pfVar3[1];
      fVar66 = pfVar3[2];
      pfVar4 = pfVar11 + puVar1[0xf];
      fStack_b2c = pfVar4[1];
      fVar71 = pfVar4[2];
      fVar117 = fVar127 - fVar55;
      fVar119 = fVar131 - fVar65;
      fVar121 = fVar133 - fVar70;
      fVar123 = fVar48 - fVar60;
      fVar107 = fVar96 - fVar108;
      fVar110 = fVar99 - fVar111;
      fVar113 = fVar100 - fVar39;
      fVar115 = fVar50 - fVar66;
      fVar86 = fVar54 - fVar124;
      fVar89 = fVar64 - fVar125;
      fVar90 = *pfVar2 - fVar126;
      fVar91 = *pfVar4 - fVar46;
      fVar134 = (float)local_b38 - fVar127;
      fVar136 = local_b38._4_4_ - fVar131;
      fVar138 = fStack_b30 - fVar133;
      fVar139 = fStack_b2c - fVar48;
      fVar140 = fVar135 - fVar96;
      fVar141 = fVar137 - fVar99;
      fVar142 = fVar44 - fVar100;
      fVar143 = fVar71 - fVar50;
      local_958[0] = fVar107 * fVar134 - fVar117 * fVar140;
      local_958[1] = fVar110 * fVar136 - fVar119 * fVar141;
      local_958[2] = fVar113 * fVar138 - fVar121 * fVar142;
      local_958[3] = fVar115 * fVar139 - fVar123 * fVar143;
      fVar81 = *(float *)(ray + k * 4);
      fStack_a9c = *(float *)(ray + k * 4 + 0x10);
      fVar84 = *(float *)(ray + k * 4 + 0x40);
      fVar95 = *(float *)(ray + k * 4 + 0x50);
      auVar130._4_4_ = fVar95;
      auVar130._0_4_ = fVar95;
      auVar130._8_4_ = fVar95;
      auVar130._12_4_ = fVar95;
      fVar144 = fVar124 - fVar81;
      fVar146 = fVar125 - fVar81;
      fVar148 = fVar126 - fVar81;
      fVar150 = fVar46 - fVar81;
      fVar127 = fVar127 - fStack_a9c;
      fVar131 = fVar131 - fStack_a9c;
      fVar133 = fVar133 - fStack_a9c;
      fVar48 = fVar48 - fStack_a9c;
      fVar101 = fVar144 * fVar95 - fVar127 * fVar84;
      fVar104 = fVar146 * fVar95 - fVar131 * fVar84;
      fVar105 = fVar148 * fVar95 - fVar133 * fVar84;
      fVar106 = fVar150 * fVar95 - fVar48 * fVar84;
      fVar124 = fVar124 - fVar128;
      fVar125 = fVar125 - fVar132;
      fVar126 = fVar126 - *pfVar5;
      fVar46 = fVar46 - *pfVar3;
      local_948[0] = fVar124 * fVar140 - fVar107 * fVar86;
      local_948[1] = fVar125 * fVar141 - fVar110 * fVar89;
      local_948[2] = fVar126 * fVar142 - fVar113 * fVar90;
      local_948[3] = fVar46 * fVar143 - fVar115 * fVar91;
      fStack_ab4 = *(float *)(ray + k * 4 + 0x20);
      fVar85 = *(float *)(ray + k * 4 + 0x60);
      fVar96 = fVar96 - fStack_ab4;
      fVar99 = fVar99 - fStack_ab4;
      fVar100 = fVar100 - fStack_ab4;
      fVar50 = fVar50 - fStack_ab4;
      fVar53 = fVar96 * fVar84 - fVar144 * fVar85;
      fVar63 = fVar99 * fVar84 - fVar146 * fVar85;
      fVar69 = fVar100 * fVar84 - fVar148 * fVar85;
      fVar74 = fVar50 * fVar84 - fVar150 * fVar85;
      local_938[0] = fVar117 * fVar86 - fVar124 * fVar134;
      local_938[1] = fVar119 * fVar89 - fVar125 * fVar136;
      local_938[2] = fVar121 * fVar90 - fVar126 * fVar138;
      local_938[3] = fVar123 * fVar91 - fVar46 * fVar139;
      fVar145 = fVar127 * fVar85 - fVar96 * fVar95;
      fVar147 = fVar131 * fVar85 - fVar99 * fVar95;
      fVar149 = fVar133 * fVar85 - fVar100 * fVar95;
      fVar151 = fVar48 * fVar85 - fVar50 * fVar95;
      fVar92 = local_958[0] * fVar84 + local_948[0] * fVar95 + local_938[0] * fVar85;
      fVar93 = local_958[1] * fVar84 + local_948[1] * fVar95 + local_938[1] * fVar85;
      fVar94 = local_958[2] * fVar84 + local_948[2] * fVar95 + local_938[2] * fVar85;
      fVar95 = local_958[3] * fVar84 + local_948[3] * fVar95 + local_938[3] * fVar85;
      uVar40 = (uint)fVar92 & 0x80000000;
      uVar45 = (uint)fVar93 & 0x80000000;
      uVar47 = (uint)fVar94 & 0x80000000;
      uVar49 = (uint)fVar95 & 0x80000000;
      fVar86 = (float)((uint)(fVar86 * fVar145 + fVar134 * fVar53 + fVar140 * fVar101) ^ uVar40);
      fVar89 = (float)((uint)(fVar89 * fVar147 + fVar136 * fVar63 + fVar141 * fVar104) ^ uVar45);
      fVar90 = (float)((uint)(fVar90 * fVar149 + fVar138 * fVar69 + fVar142 * fVar105) ^ uVar47);
      fVar91 = (float)((uint)(fVar91 * fVar151 + fVar139 * fVar74 + fVar143 * fVar106) ^ uVar49);
      fVar101 = (float)((uint)(fVar145 * fVar124 + fVar53 * fVar117 + fVar101 * fVar107) ^ uVar40);
      fVar104 = (float)((uint)(fVar147 * fVar125 + fVar63 * fVar119 + fVar104 * fVar110) ^ uVar45);
      fVar69 = (float)((uint)(fVar149 * fVar126 + fVar69 * fVar121 + fVar105 * fVar113) ^ uVar47);
      fVar74 = (float)((uint)(fVar151 * fVar46 + fVar74 * fVar123 + fVar106 * fVar115) ^ uVar49);
      fVar126 = ABS(fVar92);
      fVar46 = ABS(fVar93);
      fVar53 = ABS(fVar94);
      fVar63 = ABS(fVar95);
      bVar23 = ((0.0 <= fVar86 && 0.0 <= fVar101) && fVar92 != 0.0) && fVar86 + fVar101 <= fVar126;
      auVar88._0_4_ = -(uint)bVar23;
      bVar24 = ((0.0 <= fVar89 && 0.0 <= fVar104) && fVar93 != 0.0) && fVar89 + fVar104 <= fVar46;
      auVar88._4_4_ = -(uint)bVar24;
      bVar22 = ((0.0 <= fVar90 && 0.0 <= fVar69) && fVar94 != 0.0) && fVar90 + fVar69 <= fVar53;
      auVar88._8_4_ = -(uint)bVar22;
      bVar21 = ((0.0 <= fVar91 && 0.0 <= fVar74) && fVar95 != 0.0) && fVar91 + fVar74 <= fVar63;
      auVar88._12_4_ = -(uint)bVar21;
      local_b18 = (sVar37 & 0xfffffffffffffff0) + lVar30 * 0x60;
      in_R11D = movmskps(in_R11D,auVar88);
      pfVar8 = pfVar8 + (long)(ulong)puVar1[8];
      local_b48 = *pfVar8;
      fStack_b44 = pfVar8[1];
      fStack_b40 = pfVar8[2];
      fStack_b3c = pfVar8[3];
      pfVar9 = pfVar9 + puVar1[9];
      fVar95 = *pfVar9;
      fVar124 = pfVar9[1];
      fVar125 = pfVar9[2];
      local_7e8 = *(undefined8 *)(pfVar10 + puVar1[10]);
      uStack_7e0 = *(undefined8 *)(pfVar10 + puVar1[10] + 2);
      auVar103 = *(undefined1 (*) [16])(pfVar11 + puVar1[0xb]);
      pRVar29 = (RayK<4> *)(ulong)puVar1[8];
      scene = pSVar35;
      if (in_R11D != 0) {
        fVar92 = (float)(uVar40 ^ (uint)(fVar144 * local_958[0] +
                                        fVar127 * local_948[0] + fVar96 * local_938[0]));
        fVar131 = (float)(uVar45 ^ (uint)(fVar146 * local_958[1] +
                                         fVar131 * local_948[1] + fVar99 * local_938[1]));
        fVar99 = (float)(uVar47 ^ (uint)(fVar148 * local_958[2] +
                                        fVar133 * local_948[2] + fVar100 * local_938[2]));
        fVar133 = (float)(uVar49 ^ (uint)(fVar150 * local_958[3] +
                                         fVar48 * local_948[3] + fVar50 * local_938[3]));
        fVar127 = *(float *)(ray + k * 4 + 0x30);
        fVar96 = *(float *)(ray + k * 4 + 0x80);
        auVar56._0_4_ =
             -(uint)((fVar127 * fVar126 < fVar92 && fVar92 <= fVar96 * fVar126) && bVar23);
        auVar56._4_4_ =
             -(uint)((fVar127 * fVar46 < fVar131 && fVar131 <= fVar96 * fVar46) && bVar24);
        auVar56._8_4_ = -(uint)((fVar127 * fVar53 < fVar99 && fVar99 <= fVar96 * fVar53) && bVar22);
        auVar56._12_4_ =
             -(uint)((fVar127 * fVar63 < fVar133 && fVar133 <= fVar96 * fVar63) && bVar21);
        uVar40 = movmskps((int)ray,auVar56);
        pRVar29 = (RayK<4> *)(ulong)uVar40;
        if (uVar40 != 0) {
          local_928._8_8_ = uStack_870;
          local_928._0_8_ = local_878;
          auVar20._4_4_ = fVar46;
          auVar20._0_4_ = fVar126;
          auVar20._8_4_ = fVar53;
          auVar20._12_4_ = fVar63;
          auVar130 = rcpps(auVar130,auVar20);
          fVar81 = auVar130._0_4_;
          fVar84 = auVar130._4_4_;
          fVar127 = auVar130._8_4_;
          fVar100 = auVar130._12_4_;
          fVar48 = (float)DAT_01f46a60;
          fVar50 = DAT_01f46a60._4_4_;
          fVar93 = DAT_01f46a60._12_4_;
          fVar85 = DAT_01f46a60._8_4_;
          fVar81 = (fVar48 - fVar126 * fVar81) * fVar81 + fVar81;
          fVar84 = (fVar50 - fVar46 * fVar84) * fVar84 + fVar84;
          fVar127 = (fVar85 - fVar53 * fVar127) * fVar127 + fVar127;
          fVar100 = (fVar93 - fVar63 * fVar100) * fVar100 + fVar100;
          local_968[0] = fVar92 * fVar81;
          local_968[1] = fVar131 * fVar84;
          local_968[2] = fVar99 * fVar127;
          local_968[3] = fVar133 * fVar100;
          auVar87._0_4_ = fVar86 * fVar81;
          auVar87._4_4_ = fVar89 * fVar84;
          auVar87._8_4_ = fVar90 * fVar127;
          auVar87._12_4_ = fVar91 * fVar100;
          auVar88 = minps(auVar87,_DAT_01f46a60);
          auVar57._0_4_ = fVar81 * fVar101;
          auVar57._4_4_ = fVar84 * fVar104;
          auVar57._8_4_ = fVar127 * fVar69;
          auVar57._12_4_ = fVar100 * fVar74;
          auVar130 = minps(auVar57,_DAT_01f46a60);
          auVar76._0_4_ = fVar48 - auVar88._0_4_;
          auVar76._4_4_ = fVar50 - auVar88._4_4_;
          auVar76._8_4_ = fVar85 - auVar88._8_4_;
          auVar76._12_4_ = fVar93 - auVar88._12_4_;
          auVar82._0_4_ = fVar48 - auVar130._0_4_;
          auVar82._4_4_ = fVar50 - auVar130._4_4_;
          auVar82._8_4_ = fVar85 - auVar130._8_4_;
          auVar82._12_4_ = fVar93 - auVar130._12_4_;
          local_988 = blendvps(auVar88,auVar76,local_928);
          local_978 = blendvps(auVar130,auVar82,local_928);
          uVar36 = (ulong)(byte)uVar40;
          do {
            uVar31 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            local_8b8 = local_b08[uVar31];
            pGVar12 = (pSVar35->geometries).items[local_8b8].ptr;
            if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0070c82b;
              local_8e8 = *(undefined4 *)(local_988 + uVar31 * 4);
              fVar81 = local_968[uVar31 - 4];
              *(float *)(ray + k * 4 + 0x80) = local_968[uVar31];
              args.context = context->user;
              uVar6 = *(undefined4 *)(local_b18 + 0x50 + uVar31 * 4);
              local_8c8._4_4_ = uVar6;
              local_8c8._0_4_ = uVar6;
              local_8c8._8_4_ = uVar6;
              local_8c8._12_4_ = uVar6;
              local_8d8._4_4_ = fVar81;
              local_8d8._0_4_ = fVar81;
              local_8d8._8_4_ = fVar81;
              local_8d8._12_4_ = fVar81;
              local_918 = local_958[uVar31];
              fVar81 = local_948[uVar31];
              local_8f8 = local_938[uVar31];
              local_908._4_4_ = fVar81;
              local_908._0_4_ = fVar81;
              fStack_900 = fVar81;
              fStack_8fc = fVar81;
              fStack_914 = local_918;
              fStack_910 = local_918;
              fStack_90c = local_918;
              fStack_8f4 = local_8f8;
              fStack_8f0 = local_8f8;
              fStack_8ec = local_8f8;
              uStack_8e4 = local_8e8;
              uStack_8e0 = local_8e8;
              uStack_8dc = local_8e8;
              uStack_8b4 = local_8b8;
              uStack_8b0 = local_8b8;
              uStack_8ac = local_8b8;
              local_8a8 = (args.context)->instID[0];
              uStack_8a4 = local_8a8;
              uStack_8a0 = local_8a8;
              uStack_89c = local_8a8;
              local_898 = (args.context)->instPrimID[0];
              uStack_894 = local_898;
              uStack_890 = local_898;
              uStack_88c = local_898;
              local_b58 = *local_b20;
              args.valid = (int *)local_b58;
              args.geometryUserPtr = pGVar12->userPtr;
              args.hit = (RTCHitN *)&local_918;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar12->occlusionFilterN)(&args);
              }
              if (local_b58 == (undefined1  [16])0x0) {
                auVar58._8_4_ = 0xffffffff;
                auVar58._0_8_ = 0xffffffffffffffff;
                auVar58._12_4_ = 0xffffffff;
                auVar58 = auVar58 ^ _DAT_01f46b70;
              }
              else {
                p_Var13 = context->args->filter;
                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var13)(&args);
                }
                auVar42._0_4_ = -(uint)(local_b58._0_4_ == 0);
                auVar42._4_4_ = -(uint)(local_b58._4_4_ == 0);
                auVar42._8_4_ = -(uint)(local_b58._8_4_ == 0);
                auVar42._12_4_ = -(uint)(local_b58._12_4_ == 0);
                auVar58 = auVar42 ^ _DAT_01f46b70;
                auVar130 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar42);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar130;
              }
              if ((_DAT_01f46b40 & auVar58) != (undefined1  [16])0x0) goto LAB_0070c82b;
              *(float *)(ray + k * 4 + 0x80) = fVar96;
              pSVar35 = scene;
            }
            uVar36 = uVar36 ^ 1L << (uVar31 & 0x3f);
          } while (uVar36 != 0);
          fStack_a9c = *(float *)(ray + k * 4 + 0x10);
          fStack_ab4 = *(float *)(ray + k * 4 + 0x20);
          fVar84 = *(float *)(ray + k * 4 + 0x40);
          uVar6 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar130._4_4_ = uVar6;
          auVar130._0_4_ = uVar6;
          auVar130._8_4_ = uVar6;
          auVar130._12_4_ = uVar6;
          fVar85 = *(float *)(ray + k * 4 + 0x60);
          pRVar29 = ray;
          fVar81 = *(float *)(ray + k * 4);
        }
      }
      fStack_b3c = fVar81;
      fVar126 = auVar103._4_4_;
      fVar131 = auVar103._0_4_;
      fVar81 = auVar103._8_4_;
      fVar54 = local_b48 - fVar54;
      fVar64 = fVar95 - fVar64;
      fStack_a80 = (float)local_7e8 - fStack_a80;
      fStack_a7c = fVar131 - fStack_a7c;
      local_b38._0_4_ = fStack_b44 - (float)local_b38;
      local_b38._4_4_ = fVar124 - local_b38._4_4_;
      fStack_b30 = local_7e8._4_4_ - fStack_b30;
      fStack_b2c = fVar126 - fStack_b2c;
      fVar135 = fStack_b40 - fVar135;
      fVar137 = fVar125 - fVar137;
      fVar44 = (float)uStack_7e0 - fVar44;
      fVar71 = fVar81 - fVar71;
      fVar128 = fVar128 - local_b48;
      fVar132 = fVar132 - fVar95;
      fVar106 = fStack_a40 - (float)local_7e8;
      fVar107 = fStack_a3c - fVar131;
      fVar55 = fVar55 - fStack_b44;
      fVar65 = fVar65 - fVar124;
      fVar70 = fVar70 - local_7e8._4_4_;
      fVar60 = fVar60 - fVar126;
      fVar108 = fVar108 - fStack_b40;
      fVar111 = fVar111 - fVar125;
      fVar39 = fVar39 - (float)uStack_7e0;
      fVar66 = fVar66 - fVar81;
      local_958[0] = fVar55 * fVar135 - fVar108 * (float)local_b38;
      local_958[1] = fVar65 * fVar137 - fVar111 * local_b38._4_4_;
      local_958[2] = fVar70 * fVar44 - fVar39 * fStack_b30;
      local_958[3] = fVar60 * fVar71 - fVar66 * fStack_b2c;
      local_948[0] = fVar108 * fVar54 - fVar128 * fVar135;
      local_948[1] = fVar111 * fVar64 - fVar132 * fVar137;
      local_948[2] = fVar39 * fStack_a80 - fVar106 * fVar44;
      local_948[3] = fVar66 * fStack_a7c - fVar107 * fVar71;
      local_938[0] = fVar128 * (float)local_b38 - fVar55 * fVar54;
      local_938[1] = fVar132 * local_b38._4_4_ - fVar65 * fVar64;
      local_938[2] = fVar106 * fStack_b30 - fVar70 * fStack_a80;
      local_938[3] = fVar107 * fStack_b2c - fVar60 * fStack_a7c;
      fVar101 = local_b48 - fStack_b3c;
      fVar95 = fVar95 - fStack_b3c;
      fVar104 = (float)local_7e8 - fStack_b3c;
      fVar131 = fVar131 - fStack_b3c;
      fVar69 = fStack_b44 - fStack_a9c;
      fVar124 = fVar124 - fStack_a9c;
      fVar74 = local_7e8._4_4_ - fStack_a9c;
      fVar126 = fVar126 - fStack_a9c;
      local_b48 = fStack_b40 - fStack_ab4;
      fStack_b44 = fVar125 - fStack_ab4;
      fStack_b40 = (float)uStack_7e0 - fStack_ab4;
      fStack_b3c = fVar81 - fStack_ab4;
      fVar81 = auVar130._0_4_;
      fVar127 = auVar130._4_4_;
      fVar96 = auVar130._8_4_;
      fVar125 = auVar130._12_4_;
      fVar99 = fVar69 * fVar85 - local_b48 * fVar81;
      fVar133 = fVar124 * fVar85 - fStack_b44 * fVar127;
      fVar100 = fVar74 * fVar85 - fStack_b40 * fVar96;
      fVar46 = fVar126 * fVar85 - fStack_b3c * fVar125;
      fVar48 = local_b48 * fVar84 - fVar101 * fVar85;
      fVar50 = fStack_b44 * fVar84 - fVar95 * fVar85;
      fVar53 = fStack_b40 * fVar84 - fVar104 * fVar85;
      fVar63 = fStack_b3c * fVar84 - fVar131 * fVar85;
      fVar91 = fVar101 * fVar81 - fVar69 * fVar84;
      fVar92 = fVar95 * fVar127 - fVar124 * fVar84;
      fVar93 = fVar104 * fVar96 - fVar74 * fVar84;
      fVar94 = fVar131 * fVar125 - fVar126 * fVar84;
      fVar86 = fVar84 * local_958[0] + fVar81 * local_948[0] + fVar85 * local_938[0];
      fVar89 = fVar84 * local_958[1] + fVar127 * local_948[1] + fVar85 * local_938[1];
      fVar90 = fVar84 * local_958[2] + fVar96 * local_948[2] + fVar85 * local_938[2];
      fVar125 = fVar84 * local_958[3] + fVar125 * local_948[3] + fVar85 * local_938[3];
      uVar40 = (uint)fVar86 & 0x80000000;
      uVar45 = (uint)fVar89 & 0x80000000;
      uVar47 = (uint)fVar90 & 0x80000000;
      uVar49 = (uint)fVar125 & 0x80000000;
      fVar105 = (float)((uint)(fVar128 * fVar99 + fVar55 * fVar48 + fVar108 * fVar91) ^ uVar40);
      fVar132 = (float)((uint)(fVar132 * fVar133 + fVar65 * fVar50 + fVar111 * fVar92) ^ uVar45);
      fVar65 = (float)((uint)(fVar106 * fVar100 + fVar70 * fVar53 + fVar39 * fVar93) ^ uVar47);
      fVar111 = (float)((uint)(fVar107 * fVar46 + fVar60 * fVar63 + fVar66 * fVar94) ^ uVar49);
      fVar81 = (float)((uint)(fVar99 * fVar54 + fVar48 * (float)local_b38 + fVar91 * fVar135) ^
                      uVar40);
      fVar84 = (float)((uint)(fVar133 * fVar64 + fVar50 * local_b38._4_4_ + fVar92 * fVar137) ^
                      uVar45);
      fVar85 = (float)((uint)(fVar100 * fStack_a80 + fVar53 * fStack_b30 + fVar93 * fVar44) ^ uVar47
                      );
      fVar127 = (float)((uint)(fVar46 * fStack_a7c + fVar63 * fStack_b2c + fVar94 * fVar71) ^ uVar49
                       );
      fVar96 = ABS(fVar86);
      fVar128 = ABS(fVar89);
      fVar55 = ABS(fVar90);
      fVar108 = ABS(fVar125);
      bVar22 = ((0.0 <= fVar81 && 0.0 <= fVar105) && fVar86 != 0.0) && fVar105 + fVar81 <= fVar96;
      auVar41._0_4_ = -(uint)bVar22;
      bVar24 = ((0.0 <= fVar84 && 0.0 <= fVar132) && fVar89 != 0.0) && fVar132 + fVar84 <= fVar128;
      auVar41._4_4_ = -(uint)bVar24;
      bVar23 = ((0.0 <= fVar85 && 0.0 <= fVar65) && fVar90 != 0.0) && fVar65 + fVar85 <= fVar55;
      auVar41._8_4_ = -(uint)bVar23;
      bVar21 = ((0.0 <= fVar127 && 0.0 <= fVar111) && fVar125 != 0.0) &&
               fVar111 + fVar127 <= fVar108;
      auVar41._12_4_ = -(uint)bVar21;
      iVar27 = movmskps((int)pRVar29,auVar41);
      uVar36 = local_b00;
      if (iVar27 != 0) {
        fVar54 = (float)(uVar40 ^ (uint)(fVar101 * local_958[0] +
                                        fVar69 * local_948[0] + local_b48 * local_938[0]));
        fVar124 = (float)(uVar45 ^ (uint)(fVar95 * local_958[1] +
                                         fVar124 * local_948[1] + fStack_b44 * local_938[1]));
        fVar135 = (float)(uVar47 ^ (uint)(fVar104 * local_958[2] +
                                         fVar74 * local_948[2] + fStack_b40 * local_938[2]));
        fVar125 = (float)(uVar49 ^ (uint)(fVar131 * local_958[3] +
                                         fVar126 * local_948[3] + fStack_b3c * local_938[3]));
        fVar95 = *(float *)(ray + k * 4 + 0x30);
        bVar15 = fVar95 * fVar96 < fVar54;
        bVar16 = fVar95 * fVar128 < fVar124;
        bVar17 = fVar95 * fVar55 < fVar135;
        bVar18 = fVar95 * fVar108 < fVar125;
        auVar102._4_4_ = -(uint)bVar16;
        auVar102._0_4_ = -(uint)bVar15;
        auVar102._8_4_ = -(uint)bVar17;
        auVar102._12_4_ = -(uint)bVar18;
        fVar95 = *(float *)(ray + k * 4 + 0x80);
        auVar97._0_4_ = -(uint)((fVar54 <= fVar95 * fVar96 && bVar15) && bVar22);
        auVar97._4_4_ = -(uint)((fVar124 <= fVar95 * fVar128 && bVar16) && bVar24);
        auVar97._8_4_ = -(uint)((fVar135 <= fVar95 * fVar55 && bVar17) && bVar23);
        auVar97._12_4_ = -(uint)((fVar125 <= fVar95 * fVar108 && bVar18) && bVar21);
        uVar40 = movmskps((int)ray,auVar97);
        if (uVar40 != 0) {
          local_928 = local_888;
          pSVar35 = context->scene;
          auVar19._4_4_ = fVar128;
          auVar19._0_4_ = fVar96;
          auVar19._8_4_ = fVar55;
          auVar19._12_4_ = fVar108;
          auVar103 = rcpps(auVar102,auVar19);
          fVar131 = auVar103._0_4_;
          fVar99 = auVar103._4_4_;
          fVar137 = auVar103._8_4_;
          fVar126 = auVar103._12_4_;
          fVar133 = (float)DAT_01f46a60;
          fVar100 = DAT_01f46a60._4_4_;
          fVar70 = DAT_01f46a60._12_4_;
          fVar64 = DAT_01f46a60._8_4_;
          fVar131 = (fVar133 - fVar96 * fVar131) * fVar131 + fVar131;
          fVar99 = (fVar100 - fVar128 * fVar99) * fVar99 + fVar99;
          fVar137 = (fVar64 - fVar55 * fVar137) * fVar137 + fVar137;
          fVar126 = (fVar70 - fVar108 * fVar126) * fVar126 + fVar126;
          local_968[0] = fVar54 * fVar131;
          local_968[1] = fVar124 * fVar99;
          local_968[2] = fVar135 * fVar137;
          local_968[3] = fVar125 * fVar126;
          auVar129._0_4_ = fVar105 * fVar131;
          auVar129._4_4_ = fVar132 * fVar99;
          auVar129._8_4_ = fVar65 * fVar137;
          auVar129._12_4_ = fVar111 * fVar126;
          auVar130 = minps(auVar129,_DAT_01f46a60);
          auVar98._0_4_ = fVar131 * fVar81;
          auVar98._4_4_ = fVar99 * fVar84;
          auVar98._8_4_ = fVar137 * fVar85;
          auVar98._12_4_ = fVar126 * fVar127;
          auVar103 = minps(auVar98,_DAT_01f46a60);
          auVar77._0_4_ = fVar133 - auVar130._0_4_;
          auVar77._4_4_ = fVar100 - auVar130._4_4_;
          auVar77._8_4_ = fVar64 - auVar130._8_4_;
          auVar77._12_4_ = fVar70 - auVar130._12_4_;
          auVar83._0_4_ = fVar133 - auVar103._0_4_;
          auVar83._4_4_ = fVar100 - auVar103._4_4_;
          auVar83._8_4_ = fVar64 - auVar103._8_4_;
          auVar83._12_4_ = fVar70 - auVar103._12_4_;
          local_988 = blendvps(auVar130,auVar77,local_888);
          local_978 = blendvps(auVar103,auVar83,local_888);
          uVar31 = (ulong)(uVar40 & 0xff);
          do {
            uVar14 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
              }
            }
            local_8b8 = local_b08[uVar14];
            local_b38 = (pSVar35->geometries).items[local_8b8].ptr;
            if ((local_b38->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (local_b38->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0070c82b;
              local_8e8 = *(undefined4 *)(local_988 + uVar14 * 4);
              fVar81 = local_968[uVar14 - 4];
              *(float *)(ray + k * 4 + 0x80) = local_968[uVar14];
              args.context = context->user;
              uVar6 = *(undefined4 *)(local_b18 + 0x50 + uVar14 * 4);
              local_8c8._4_4_ = uVar6;
              local_8c8._0_4_ = uVar6;
              local_8c8._8_4_ = uVar6;
              local_8c8._12_4_ = uVar6;
              local_8d8._4_4_ = fVar81;
              local_8d8._0_4_ = fVar81;
              local_8d8._8_4_ = fVar81;
              local_8d8._12_4_ = fVar81;
              local_918 = local_958[uVar14];
              local_908._4_4_ = local_948[uVar14];
              local_8f8 = local_938[uVar14];
              fStack_914 = local_918;
              fStack_910 = local_918;
              fStack_90c = local_918;
              local_908._0_4_ = local_908._4_4_;
              fStack_900 = (float)local_908._4_4_;
              fStack_8fc = (float)local_908._4_4_;
              fStack_8f4 = local_8f8;
              fStack_8f0 = local_8f8;
              fStack_8ec = local_8f8;
              uStack_8e4 = local_8e8;
              uStack_8e0 = local_8e8;
              uStack_8dc = local_8e8;
              uStack_8b4 = local_8b8;
              uStack_8b0 = local_8b8;
              uStack_8ac = local_8b8;
              local_8a8 = (args.context)->instID[0];
              uStack_8a4 = local_8a8;
              uStack_8a0 = local_8a8;
              uStack_89c = local_8a8;
              local_898 = (args.context)->instPrimID[0];
              uStack_894 = local_898;
              uStack_890 = local_898;
              uStack_88c = local_898;
              local_b58 = *local_b20;
              args.valid = (int *)local_b58;
              args.geometryUserPtr = local_b38->userPtr;
              args.hit = (RTCHitN *)&local_918;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (local_b38->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*local_b38->occlusionFilterN)(&args);
              }
              if (local_b58 == (undefined1  [16])0x0) {
                auVar59._8_4_ = 0xffffffff;
                auVar59._0_8_ = 0xffffffffffffffff;
                auVar59._12_4_ = 0xffffffff;
                auVar59 = auVar59 ^ _DAT_01f46b70;
              }
              else {
                p_Var13 = context->args->filter;
                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((local_b38->field_8).field_0x2 & 0x40) != 0)
                    ))) {
                  (*p_Var13)(&args);
                }
                auVar43._0_4_ = -(uint)(local_b58._0_4_ == 0);
                auVar43._4_4_ = -(uint)(local_b58._4_4_ == 0);
                auVar43._8_4_ = -(uint)(local_b58._8_4_ == 0);
                auVar43._12_4_ = -(uint)(local_b58._12_4_ == 0);
                auVar59 = auVar43 ^ _DAT_01f46b70;
                auVar103 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar43);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar103;
              }
              if ((_DAT_01f46b40 & auVar59) != (undefined1  [16])0x0) goto LAB_0070c82b;
              *(float *)(ray + k * 4 + 0x80) = fVar95;
              uVar36 = local_b00;
              fStack_a40 = 0.0;
              fStack_a3c = 0.0;
            }
            uVar31 = uVar31 ^ 1L << (uVar14 & 0x3f);
          } while (uVar31 != 0);
        }
      }
      fVar84 = local_808;
      fVar96 = fStack_804;
      fVar128 = fStack_800;
      fVar55 = fStack_7fc;
      fVar85 = local_828;
      fVar108 = fStack_824;
      fVar54 = fStack_820;
      fVar135 = fStack_81c;
      iVar27 = local_858;
      iVar109 = iStack_854;
      iVar112 = iStack_850;
      iVar114 = iStack_84c;
      iVar116 = local_868;
      iVar118 = iStack_864;
      iVar120 = iStack_860;
      iVar122 = iStack_85c;
      fVar81 = local_7f8;
      fVar125 = fStack_7f4;
      fVar131 = fStack_7f0;
      fVar99 = fStack_7ec;
      fVar95 = local_818;
      fVar132 = fStack_814;
      fVar65 = fStack_810;
      fVar111 = fStack_80c;
      fVar124 = local_838;
      fVar64 = fStack_834;
      fVar137 = fStack_830;
      fVar126 = fStack_82c;
      fVar127 = local_848;
      fVar133 = fStack_844;
      fVar100 = fStack_840;
      fVar70 = fStack_83c;
    }
  } while( true );
LAB_0070c82b:
  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
  goto LAB_0070c848;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }